

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O0

void __thiscall Imf_2_5::MultiViewChannelName::~MultiViewChannelName(MultiViewChannelName *this)

{
  MultiViewChannelName *in_RDI;
  
  ~MultiViewChannelName(in_RDI);
  operator_delete(in_RDI,0x70);
  return;
}

Assistant:

virtual ~MultiViewChannelName() {}